

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_gzip.c
# Opt level: O1

ssize_t gzip_filter_read(archive_read_filter *self,void **p)

{
  undefined8 *puVar1;
  private_data_conflict *state;
  bool bVar2;
  uint uVar3;
  int iVar4;
  ssize_t sVar5;
  unsigned_long uVar6;
  Bytef *pBVar7;
  ssize_t sVar8;
  void *pvVar9;
  long lVar10;
  char *pcVar11;
  archive_read *paVar12;
  ssize_t avail_in;
  ssize_t avail;
  ssize_t local_48;
  uInt local_40;
  undefined4 uStack_3c;
  void **local_38;
  
  puVar1 = (undefined8 *)self->data;
  puVar1[3] = puVar1[0xf];
  iVar4 = *(int *)(puVar1 + 0x10);
  *(int *)(puVar1 + 4) = iVar4;
  local_38 = p;
  do {
    if ((iVar4 == 0) || (*(char *)(puVar1 + 0x15) != '\0')) goto LAB_0022f084;
    if (*(char *)(puVar1 + 0xe) == '\0') {
      state = (private_data_conflict *)self->data;
      bVar2 = false;
      sVar5 = peek_at_header(self->upstream,(int *)0x0,state);
      if (sVar5 == 0) {
        sVar8 = 1;
      }
      else {
        __archive_read_filter_consume(self->upstream,sVar5);
        uVar6 = crc32(0,0,0);
        state->crc = uVar6;
        pBVar7 = (Bytef *)__archive_read_filter_ahead(self->upstream,1,(ssize_t *)&local_40);
        (state->stream).next_in = pBVar7;
        (state->stream).avail_in = local_40;
        uVar3 = inflateInit2_(state,0xfffffff1,"1.2.11",0x70);
        switch(uVar3) {
        case 0:
          state->in_stream = '\x01';
          bVar2 = false;
          sVar8 = 0;
          goto LAB_0022ef42;
        case 0xfffffffa:
          paVar12 = self->archive;
          iVar4 = -1;
          pcVar11 = "Internal error initializing compression library: invalid library version";
          break;
        default:
          archive_set_error(&self->archive->archive,-1,
                            "Internal error initializing compression library:  Zlib error %d",
                            (ulong)uVar3);
          goto LAB_0022ef39;
        case 0xfffffffc:
          paVar12 = self->archive;
          iVar4 = 0xc;
          pcVar11 = "Internal error initializing compression library: out of memory";
          break;
        case 0xfffffffe:
          paVar12 = self->archive;
          iVar4 = -1;
          pcVar11 = "Internal error initializing compression library: invalid setup parameter";
        }
        archive_set_error(&paVar12->archive,iVar4,pcVar11);
LAB_0022ef39:
        sVar8 = -0x1e;
        bVar2 = true;
      }
LAB_0022ef42:
      if (sVar5 == 0) {
        *(undefined1 *)(puVar1 + 0x15) = 1;
LAB_0022f084:
        pvVar9 = (void *)puVar1[0xf];
        lVar10 = puVar1[3] - (long)pvVar9;
        puVar1[0x11] = puVar1[0x11] + lVar10;
        if (lVar10 == 0) {
          pvVar9 = (void *)0x0;
        }
        *local_38 = pvVar9;
        return lVar10;
      }
      if (bVar2) {
        return sVar8;
      }
    }
    pvVar9 = __archive_read_filter_ahead(self->upstream,1,&local_48);
    *puVar1 = pvVar9;
    if (pvVar9 == (void *)0x0) {
      paVar12 = self->archive;
      pcVar11 = "truncated gzip input";
LAB_0022f067:
      archive_set_error(&paVar12->archive,-1,pcVar11);
      return -0x1e;
    }
    if (0xffffffff < local_48) {
      local_48 = 0xffffffff;
    }
    *(undefined4 *)(puVar1 + 1) = (undefined4)local_48;
    iVar4 = inflate(puVar1,0);
    if (iVar4 == 1) {
      __archive_read_filter_consume(self->upstream,local_48 - (ulong)*(uint *)(puVar1 + 1));
      *(undefined1 *)((long)self->data + 0x70) = 0;
      iVar4 = inflateEnd();
      if (iVar4 == 0) {
        pvVar9 = __archive_read_filter_ahead(self->upstream,8,(ssize_t *)&local_40);
        sVar5 = -0x1e;
        bVar2 = true;
        if ((pvVar9 != (void *)0x0) && (CONCAT44(uStack_3c,local_40) != 0)) {
          __archive_read_filter_consume(self->upstream,8);
          bVar2 = false;
          sVar5 = 0;
        }
      }
      else {
        archive_set_error(&self->archive->archive,-1,"Failed to clean up gzip decompressor");
        sVar5 = -0x1e;
        bVar2 = true;
      }
      if (bVar2) {
        return sVar5;
      }
    }
    else {
      if (iVar4 != 0) {
        paVar12 = self->archive;
        pcVar11 = "gzip decompression failed";
        goto LAB_0022f067;
      }
      __archive_read_filter_consume(self->upstream,local_48 - (ulong)*(uint *)(puVar1 + 1));
    }
    iVar4 = *(int *)(puVar1 + 4);
  } while( true );
}

Assistant:

static ssize_t
gzip_filter_read(struct archive_read_filter *self, const void **p)
{
	struct private_data *state;
	size_t decompressed;
	ssize_t avail_in, max_in;
	int ret;

	state = (struct private_data *)self->data;

	/* Empty our output buffer. */
	state->stream.next_out = state->out_block;
	state->stream.avail_out = (uInt)state->out_block_size;

	/* Try to fill the output buffer. */
	while (state->stream.avail_out > 0 && !state->eof) {
		/* If we're not in a stream, read a header
		 * and initialize the decompression library. */
		if (!state->in_stream) {
			ret = consume_header(self);
			if (ret == ARCHIVE_EOF) {
				state->eof = 1;
				break;
			}
			if (ret < ARCHIVE_OK)
				return (ret);
		}

		/* Peek at the next available data. */
		/* ZLib treats stream.next_in as const but doesn't declare
		 * it so, hence this ugly cast. */
		state->stream.next_in = (unsigned char *)(uintptr_t)
		    __archive_read_filter_ahead(self->upstream, 1, &avail_in);
		if (state->stream.next_in == NULL) {
			archive_set_error(&self->archive->archive,
			    ARCHIVE_ERRNO_MISC,
			    "truncated gzip input");
			return (ARCHIVE_FATAL);
		}
		if (UINT_MAX >= SSIZE_MAX)
			max_in = SSIZE_MAX;
		else
			max_in = UINT_MAX;
		if (avail_in > max_in)
			avail_in = max_in;
		state->stream.avail_in = (uInt)avail_in;

		/* Decompress and consume some of that data. */
		ret = inflate(&(state->stream), 0);
		switch (ret) {
		case Z_OK: /* Decompressor made some progress. */
			__archive_read_filter_consume(self->upstream,
			    avail_in - state->stream.avail_in);
			break;
		case Z_STREAM_END: /* Found end of stream. */
			__archive_read_filter_consume(self->upstream,
			    avail_in - state->stream.avail_in);
			/* Consume the stream trailer; release the
			 * decompression library. */
			ret = consume_trailer(self);
			if (ret < ARCHIVE_OK)
				return (ret);
			break;
		default:
			/* Return an error. */
			archive_set_error(&self->archive->archive,
			    ARCHIVE_ERRNO_MISC,
			    "gzip decompression failed");
			return (ARCHIVE_FATAL);
		}
	}

	/* We've read as much as we can. */
	decompressed = state->stream.next_out - state->out_block;
	state->total_out += decompressed;
	if (decompressed == 0)
		*p = NULL;
	else
		*p = state->out_block;
	return (decompressed);
}